

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuspendingreply.h
# Opt level: O0

void __thiscall
QDBusPendingReply<QDBusObjectPath>::calculateMetaTypes(QDBusPendingReply<QDBusObjectPath> *this)

{
  long lVar1;
  bool bVar2;
  int in_EDI;
  long in_FS_OFFSET;
  array<QMetaType,_1UL> typeIds;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QExplicitlySharedDataPointer<QDBusPendingCallPrivate>::operator!
                    ((QExplicitlySharedDataPointer<QDBusPendingCallPrivate> *)0x12803a);
  if (!bVar2) {
    QDBusPendingReplyTypes::metaTypeFor<QDBusObjectPath>();
    std::array<QMetaType,_1UL>::data((array<QMetaType,_1UL> *)0x128062);
    QDBusPendingReplyBase::setMetaTypes(in_EDI,(QMetaType *)0x1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void calculateMetaTypes()
    {
        if (!d) return;
        if constexpr (Count == 0) {
                setMetaTypes(0, nullptr);
        } else {
            std::array<QMetaType, Count> typeIds = { QDBusPendingReplyTypes::metaTypeFor<Types>()... };
            setMetaTypes(Count, typeIds.data());
        }
    }